

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::ConvolutionParameter::SharedDtor(ConvolutionParameter *this)

{
  ConvolutionParameter *pCVar1;
  ConvolutionParameter *this_local;
  
  pCVar1 = internal_default_instance();
  if ((this != pCVar1) && (this->weight_filler_ != (FillerParameter *)0x0)) {
    (*(this->weight_filler_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pCVar1 = internal_default_instance();
  if ((this != pCVar1) && (this->bias_filler_ != (FillerParameter *)0x0)) {
    (*(this->bias_filler_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  return;
}

Assistant:

void ConvolutionParameter::SharedDtor() {
  if (this != internal_default_instance()) {
    delete weight_filler_;
  }
  if (this != internal_default_instance()) {
    delete bias_filler_;
  }
}